

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

gdImagePtr gdImageRotateInterpolated(gdImagePtr src,float angle,int bgcolor)

{
  gdInterpolationMethod gVar1;
  int iVar2;
  gdImagePtr pgVar3;
  float fVar4;
  double dVar5;
  gdImagePtr dst;
  int local_20;
  int angle_rounded;
  int bgcolor_local;
  float angle_local;
  gdImagePtr src_local;
  
  fVar4 = floorf(angle * 100.0);
  dVar5 = fmod((double)(int)fVar4,36000.0);
  iVar2 = (int)dVar5;
  if ((src == (gdImagePtr)0x0) || (bgcolor < 0)) {
    return (gdImagePtr)0x0;
  }
  local_20 = bgcolor;
  if (src->trueColor == 0) {
    if (bgcolor < 0x100) {
      local_20 = src->alpha[bgcolor] * 0x1000000 + src->red[bgcolor] * 0x10000 +
                 src->green[bgcolor] * 0x100 + src->blue[bgcolor];
    }
    gdImagePaletteToTrueColor(src);
  }
  if (iVar2 == -27000) {
LAB_00122d38:
    src_local = gdImageRotate90(src,0);
  }
  else {
    if (iVar2 == -18000) {
LAB_00122d4c:
      pgVar3 = gdImageRotate180(src,0);
      return pgVar3;
    }
    if (iVar2 != -9000) {
      if (iVar2 == 0) {
        pgVar3 = gdImageClone(src);
        if (pgVar3 == (gdImagePtr)0x0) {
          return (gdImagePtr)0x0;
        }
        if (pgVar3->trueColor != 0) {
          return pgVar3;
        }
        gdImagePaletteToTrueColor(pgVar3);
        return pgVar3;
      }
      if (iVar2 == 9000) goto LAB_00122d38;
      if (iVar2 == 18000) goto LAB_00122d4c;
      if (iVar2 != 27000) {
        if ((src->interpolation_id == GD_DEFAULT) || (GD_METHOD_COUNT < src->interpolation_id)) {
          return (gdImagePtr)0x0;
        }
        gVar1 = src->interpolation_id;
        if (((gVar1 != GD_BILINEAR_FIXED) && (gVar1 != GD_BICUBIC_FIXED)) &&
           (gVar1 == GD_NEAREST_NEIGHBOUR)) {
          pgVar3 = gdImageRotateNearestNeighbour(src,angle,local_20);
          return pgVar3;
        }
        pgVar3 = gdImageRotateGeneric(src,angle,local_20);
        return pgVar3;
      }
    }
    src_local = gdImageRotate270(src,0);
  }
  return src_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageRotateInterpolated(const gdImagePtr src, const float angle, int bgcolor)
{
	/* round to two decimals and keep the 100x multiplication to use it in the common square angles 
	   case later. Keep the two decimal precisions so smaller rotation steps can be done, useful for
	   slow animations, f.e. */
	const int angle_rounded = fmod((int) floorf(angle * 100), 360 * 100);

	if (src == NULL || bgcolor < 0) {
		return NULL;
	}

	/* impact perf a bit, but not that much. Implementation for palette
	   images can be done at a later point.
	*/
	if (src->trueColor == 0) {
		if (bgcolor < gdMaxColors) {
			bgcolor =  gdTrueColorAlpha(src->red[bgcolor], src->green[bgcolor], src->blue[bgcolor], src->alpha[bgcolor]);
		}
		gdImagePaletteToTrueColor(src);
	}

	/* 0 && 90 degrees multiple rotation, 0 rotation simply clones the return image and convert it
	   to truecolor, as we must return truecolor image. */
	switch (angle_rounded) {
		case    0: {
			gdImagePtr dst = gdImageClone(src);

			if (dst == NULL) {
				return NULL;
			}
			if (dst->trueColor == 0) {
				gdImagePaletteToTrueColor(dst);
			}
			return dst;
		}

		case -27000:
		case   9000:
			return gdImageRotate90(src, 0);

		case -18000:
		case  18000:
			return gdImageRotate180(src, 0);

		case  -9000:
		case  27000:
			return gdImageRotate270(src, 0);
	}

	if (src->interpolation_id < 1 || src->interpolation_id > GD_METHOD_COUNT) {
		return NULL;
	}

	switch (src->interpolation_id) {
		case GD_NEAREST_NEIGHBOUR:
			return gdImageRotateNearestNeighbour(src, angle, bgcolor);
			break;

		case GD_BILINEAR_FIXED:
		case GD_BICUBIC_FIXED:
		default:
			return gdImageRotateGeneric(src, angle, bgcolor);
	}
	return NULL;
}